

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O0

void wasm::UniqueNameMapper::uniquify(wasm::Expression*)::Walker::
     doPostVisitControlFlow(Walker*,wasm::Expression___(Walker *self,Expression **currp)

{
  Expression **currp_local;
  Walker *self_local;
  
  currp_local = (Expression **)self;
  BranchUtils::
  operateOnScopeNameDefs<wasm::UniqueNameMapper::uniquify(wasm::Expression*)::Walker::doPostVisitControlFlow(Walker*,wasm::Expression**)::_lambda(wasm::Name&)_1_>
            (*currp,(anon_class_8_1_89917c4a)&currp_local);
  return;
}

Assistant:

static void doPostVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          self->mapper.popLabelName(name);
        }
      });
    }